

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

void __thiscall jpgd::jpeg_decoder::check_huff_tables(jpeg_decoder *this)

{
  huff_tables *pH;
  long lVar1;
  int i;
  
  lVar1 = 0;
  while( true ) {
    if (this->m_comps_in_scan <= lVar1) {
      for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
        if (this->m_huff_num[lVar1] != (uint8 *)0x0) {
          pH = this->m_pHuff_tabs[lVar1];
          if (pH == (huff_tables *)0x0) {
            pH = (huff_tables *)alloc(this,0x1104,false);
            this->m_pHuff_tabs[lVar1] = pH;
          }
          make_huff_table(this,(int)lVar1,pH);
        }
      }
      return;
    }
    if (((this->m_spectral_start == 0) &&
        (this->m_huff_num[this->m_comp_dc_tab[this->m_comp_list[lVar1]]] == (uint8 *)0x0)) ||
       ((0 < this->m_spectral_end &&
        (this->m_huff_num[this->m_comp_ac_tab[this->m_comp_list[lVar1]]] == (uint8 *)0x0)))) break;
    lVar1 = lVar1 + 1;
  }
  stop_decoding(this,JPGD_UNDEFINED_HUFF_TABLE);
}

Assistant:

void jpeg_decoder::check_huff_tables()
{
  for (int i = 0; i < m_comps_in_scan; i++)
  {
    if ((m_spectral_start == 0) && (m_huff_num[m_comp_dc_tab[m_comp_list[i]]] == NULL))
      stop_decoding(JPGD_UNDEFINED_HUFF_TABLE);

    if ((m_spectral_end > 0) && (m_huff_num[m_comp_ac_tab[m_comp_list[i]]] == NULL))
      stop_decoding(JPGD_UNDEFINED_HUFF_TABLE);
  }

  for (int i = 0; i < JPGD_MAX_HUFF_TABLES; i++)
    if (m_huff_num[i])
    {
      if (!m_pHuff_tabs[i])
        m_pHuff_tabs[i] = (huff_tables *)alloc(sizeof(huff_tables));

      make_huff_table(i, m_pHuff_tabs[i]);
    }
}